

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,void *ptr)

{
  ImGuiID id;
  uint *puVar1;
  void *ptr_local;
  
  ptr_local = ptr;
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)&this->IDStack);
  id = ImHashData(&ptr_local,8,*puVar1);
  ImGui::KeepAliveID(id);
  if (GImGui->DebugHookIdInfo == id) {
    ImGui::DebugHookIdInfo(id,0xc,ptr,(void *)0x0);
  }
  return id;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
    ImGui::KeepAliveID(id);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_Pointer, ptr, NULL);
    return id;
}